

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O3

int tcv_get_sfp_plus_cable_technology(tcv_t *tcv,sfp_plus_cable_technology_t *technology)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if ((technology != (sfp_plus_cable_technology_t *)0x0) && (iVar1 == 0)) {
      iVar2 = -0xd;
      if ((tcv->created == true) && (tcv->initialized == true)) {
        iVar2 = (*tcv->fun->get_sfp_plus_cable_technology)(tcv,technology);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    }
  }
  return iVar2;
}

Assistant:

int tcv_get_sfp_plus_cable_technology(tcv_t *tcv,
                                      sfp_plus_cable_technology_t *technology)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !technology)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_sfp_plus_cable_technology(tcv, technology);
	}

	tcv_unlock(tcv);
	return ret;
}